

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12_test.cc
# Opt level: O1

void __thiscall PKCS12Test_TestPBES2_Test::TestBody(PKCS12Test_TestPBES2_Test *this)

{
  Span<const_unsigned_char> der;
  Span<const_unsigned_char> der_00;
  string data;
  string local_48;
  string local_28;
  
  GetTestData_abi_cxx11_(&local_48,"crypto/pkcs8/test/pbes2_sha1.p12");
  der.size_ = local_48._M_string_length;
  der.data_ = (uchar *)local_48._M_dataplus._M_p;
  TestImpl("kPBES2WithSHA1",der,"foo",(char *)0x0);
  GetTestData_abi_cxx11_(&local_28,"crypto/pkcs8/test/pbes2_sha256.p12");
  std::__cxx11::string::operator=((string *)&local_48,(string *)&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  der_00.size_ = local_48._M_string_length;
  der_00.data_ = (uchar *)local_48._M_dataplus._M_p;
  TestImpl("kPBES2WithSHA256",der_00,"foo",(char *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(PKCS12Test, TestPBES2) {
  // pbes2_sha1.p12 is a PKCS#12 file using PBES2 and HMAC-SHA-1 created with:
  // openssl pkcs12 -export -inkey key.pem -in cert.pem -keypbe AES-128-CBC
  // -certpbe AES-128-CBC
  //
  // This was generated with an older OpenSSL, which used hmacWithSHA1 as the
  // PRF. (There is currently no way to specify the PRF in the pkcs12 command.)
  std::string data = GetTestData("crypto/pkcs8/test/pbes2_sha1.p12");
  TestImpl("kPBES2WithSHA1", bssl::StringAsBytes(data), kPassword, nullptr);

  // pbes2_sha256.p12 is a PKCS#12 file using PBES2 and HMAC-SHA-256. It was
  // generated in the same way as pbes2_sha1.p12, but using OpenSSL 1.1.1b,
  // which uses hmacWithSHA256 as the PRF.
  data = GetTestData("crypto/pkcs8/test/pbes2_sha256.p12");
  TestImpl("kPBES2WithSHA256", bssl::StringAsBytes(data), kPassword, nullptr);
}